

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

PCMSegment *
Storage::Encodings::AppleGCR::Macintosh::data
          (PCMSegment *__return_storage_ptr__,uint8_t sector,uint8_t *source)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  allocator_type local_41;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0x2c6,&local_41);
  *local_40._M_impl.super__Vector_impl_data._M_start = 0xd5;
  local_40._M_impl.super__Vector_impl_data._M_start[1] = 0xaa;
  local_40._M_impl.super__Vector_impl_data._M_start[2] = 0xad;
  local_40._M_impl.super__Vector_impl_data._M_start[3] =
       (anonymous_namespace)::six_and_two_mapping[sector & 0x3f];
  uVar7 = 0;
  uVar5 = 0;
  uVar4 = 0;
  for (lVar6 = 0; lVar6 != 700; lVar6 = lVar6 + 4) {
    uVar8 = (uVar7 >> 7) + uVar7 * 2;
    bVar3 = *source;
    uVar4 = uVar4 + (uVar7 >> 7) + (uint)bVar3;
    pbVar1 = source + 1;
    uVar5 = uVar5 + *pbVar1 + (uVar4 >> 8);
    if (lVar6 == 0x2b8) {
      source = source + 2;
      uVar10 = 0;
      uVar7 = uVar8;
    }
    else {
      pbVar2 = source + 2;
      uVar7 = (uVar5 >> 8) + uVar8 + (uint)*pbVar2;
      source = source + 3;
      uVar10 = (*pbVar2 ^ uVar5) & 0xff;
    }
    uVar8 = bVar3 ^ uVar8;
    uVar9 = *pbVar1 ^ uVar4;
    uVar7 = uVar7 & 0xff;
    uVar5 = uVar5 & 0xff;
    uVar4 = uVar4 & 0xff;
    local_40._M_impl.super__Vector_impl_data._M_start[lVar6 + 5] =
         (anonymous_namespace)::six_and_two_mapping[uVar8 & 0x3f];
    local_40._M_impl.super__Vector_impl_data._M_start[lVar6 + 6] =
         (anonymous_namespace)::six_and_two_mapping[uVar9 & 0x3f];
    local_40._M_impl.super__Vector_impl_data._M_start[lVar6 + 7] =
         (anonymous_namespace)::six_and_two_mapping[uVar10 & 0x3f];
    local_40._M_impl.super__Vector_impl_data._M_start[lVar6 + 4] =
         (anonymous_namespace)::six_and_two_mapping
         [uVar10 >> 6 | uVar9 >> 4 & 0xc | uVar8 >> 2 & 0x30];
  }
  local_40._M_impl.super__Vector_impl_data._M_start[0x2c0] =
       (anonymous_namespace)::six_and_two_mapping[uVar4 & 0x3f];
  local_40._M_impl.super__Vector_impl_data._M_start[0x2c1] =
       (anonymous_namespace)::six_and_two_mapping[uVar5 & 0x3f];
  local_40._M_impl.super__Vector_impl_data._M_start[0x2c2] =
       (anonymous_namespace)::six_and_two_mapping[uVar7 & 0x3f];
  local_40._M_impl.super__Vector_impl_data._M_start[0x2bf] =
       (anonymous_namespace)::six_and_two_mapping[uVar7 >> 6 | uVar5 >> 4 & 0xc | uVar4 >> 2 & 0x30]
  ;
  local_40._M_impl.super__Vector_impl_data._M_start[0x2c3] = 0xde;
  local_40._M_impl.super__Vector_impl_data._M_start[0x2c4] = 0xaa;
  local_40._M_impl.super__Vector_impl_data._M_start[0x2c5] = 0xeb;
  Disk::PCMSegment::PCMSegment
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Storage::Disk::PCMSegment AppleGCR::Macintosh::data(uint8_t sector, const uint8_t *source) {
	std::vector<uint8_t> output(710);
	int checksum[3] = {0, 0, 0};

	// Write prologue.
	output[0] = data_prologue[0];
	output[1] = data_prologue[1];
	output[2] = data_prologue[2];

	// Add the sector number.
	output[3] = six_and_two_mapping[sector & 0x3f];

	// The Macintosh has a similar checksum-as-it-goes approach to encoding
	// to the Apple II, but works entirely differently. Each three bytes of
	// input are individually encoded to four GCR bytes, their output values
	// being a (mutating) function of the current checksum.
	//
	// Address references below, such as 'Cf. 18FA4' are to addresses in the
	// Macintosh Plus ROM.
	for(size_t c = 0; c < 175; ++c) {
		uint8_t values[3];

		// The low byte of the checksum is rotated left one position; Cf. 18FA4.
		checksum[0] = (checksum[0] << 1) | (checksum[0] >> 7);

		// See 18FBA and 18FBC: an ADDX (with the carry left over from the roll)
		// and an EOR act to update the checksum and generate the next output.
		values[0] = uint8_t(*source ^ checksum[0]);
		checksum[2] += *source + (checksum[0] >> 8);
		++source;

		// As above, but now 18FD0 and 18FD2.
		values[1] = uint8_t(*source ^ checksum[2]);
		checksum[1] += *source + (checksum[2] >> 8);
		++source;

		// Avoid a potential read overrun, but otherwise continue as before.
		if(c == 174) {
			values[2] = 0;
		} else {
			values[2] = uint8_t(*source ^ checksum[1]);
			checksum[0] += *source + (checksum[1] >> 8);
			++source;
		}

		// Throw away the top bits of checksum[1] and checksum[2]; the original
		// routine is byte centric, the longer ints here are just to retain the
		// carry after each add transientliy.
		checksum[0] &= 0xff;
		checksum[1] &= 0xff;
		checksum[2] &= 0xff;

		// Having mutated those three bytes according to the current checksum,
		// and the checksum according to those bytes, run them through the
		// GCR conversion table.
		output[4 + c*4 + 1] = six_and_two_mapping[values[0] & 0x3f];
		output[4 + c*4 + 2] = six_and_two_mapping[values[1] & 0x3f];
		output[4 + c*4 + 3] = six_and_two_mapping[values[2] & 0x3f];
		output[4 + c*4 + 0] = six_and_two_mapping[
			((values[0] >> 2) & 0x30) |
			((values[1] >> 4) & 0x0c) |
			((values[2] >> 6) & 0x03)
		];
	}

	// Also write the checksum.
	//
	// Caveat: the first byte written here will overwrite the final byte that
	// was deposited in the loop above. That's deliberate. The final byte from
	// the loop above doesn't contain any useful content, and isn't actually
	// included on disk.
	output[704] = six_and_two_mapping[checksum[2] & 0x3f];
	output[705] = six_and_two_mapping[checksum[1] & 0x3f];
	output[706] = six_and_two_mapping[checksum[0] & 0x3f];
	output[703] = six_and_two_mapping[
		((checksum[2] >> 2) & 0x30) |
		((checksum[1] >> 4) & 0x0c) |
		((checksum[0] >> 6) & 0x03)
	];

	// Write epilogue.
	output[707] = epilogue[0];
	output[708] = epilogue[1];
	output[709] = epilogue[2];

	return Storage::Disk::PCMSegment(output);
}